

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__parse_png_file(stbi__png *z,int scan,int req_comp)

{
  stbi__uint32 y;
  stbi__context *s;
  byte *pbVar1;
  stbi__context *psVar2;
  bool bVar3;
  stbi_uc **ppsVar4;
  stbi_uc sVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  stbi_uc *psVar13;
  stbi_uc *psVar14;
  stbi_uc *psVar15;
  uint uVar16;
  uint7 uVar18;
  long lVar17;
  byte bVar19;
  stbi_uc *psVar20;
  ulong uVar21;
  long lVar22;
  stbi__uint16 *tc_00;
  stbi__png *z_00;
  uint uVar23;
  stbi__uint32 raw_len_00;
  stbi__uint32 sVar24;
  long lVar25;
  stbi__png *psVar26;
  uint uVar27;
  long lVar28;
  byte bVar29;
  ulong uVar30;
  size_t sVar31;
  stbi_uc asStack_4f8 [8];
  stbi_uc palette [1024];
  undefined2 local_e6 [3];
  stbi_uc *psStack_e0;
  stbi__uint16 tc16 [3];
  stbi__uint32 local_cc;
  stbi__uint32 local_c8;
  stbi__uint32 raw_len;
  ulong local_c0;
  stbi_uc *local_b8;
  size_t local_b0;
  uint local_a8;
  uint local_a4;
  undefined8 local_a0;
  ulong local_98;
  int local_8c;
  stbi_uc **local_88;
  stbi_uc *local_80;
  stbi__png *local_78;
  ulong local_70;
  ulong local_68;
  stbi_uc *local_60;
  char local_54 [4];
  stbi_uc tc [3];
  stbi_uc *psStack_50;
  
  local_54[2] = 0;
  local_54[0] = '\0';
  local_54[1] = '\0';
  s = z->s;
  z->idata = (stbi_uc *)0x0;
  z->expanded = (stbi_uc *)0x0;
  z->out = (stbi_uc *)0x0;
  iVar7 = stbi__check_png_header(s);
  if (iVar7 == 0) {
    return 0;
  }
  if (scan == 1) {
    return 1;
  }
  local_60 = (stbi_uc *)CONCAT44(local_60._4_4_,scan);
  local_88 = &z->idata;
  local_80 = s->buffer_start;
  psVar15 = s->buffer_start + 1;
  bVar3 = true;
  local_98 = 0;
  local_c0 = 0;
  local_8c = 0;
  local_68 = 0;
  local_b0 = 0;
  local_70 = 0;
  local_a0 = 0;
  bVar29 = 0;
  local_a8 = req_comp;
  local_78 = z;
  do {
    iVar7 = stbi__get16be(s);
    uVar8 = stbi__get16be(s);
    psStack_50 = (stbi_uc *)(ulong)(iVar7 * 0x10000 + uVar8);
    uVar9 = stbi__get16be(s);
    uVar10 = stbi__get16be(s);
    psVar26 = local_78;
    psVar14 = local_80;
    ppsVar4 = local_88;
    uVar27 = uVar9 << 0x10 | uVar10;
    uVar12 = (uint)psStack_50;
    if ((int)uVar27 < 0x49484452) {
      if (uVar27 == 0x43674249) {
        stbi__skip(s,uVar12);
        local_8c = 1;
      }
      else {
        iVar7 = (int)local_70;
        if (uVar27 == 0x49444154) {
          if (bVar3) goto LAB_00129e36;
          if ((bVar29 != 0) && ((uint)local_68 == 0)) {
            stbi__g_failure_reason = "no PLTE";
            return 0;
          }
          if ((int)local_60 == 2) {
            s->img_n = (uint)bVar29;
            return 1;
          }
          uVar8 = uVar12 + iVar7;
          if ((int)uVar8 < iVar7) {
            return 0;
          }
          if ((uint)local_b0 < uVar8) {
            uVar21 = 0x1000;
            if (0x1000 < uVar12) {
              uVar21 = (ulong)psStack_50 & 0xffffffff;
            }
            if ((uint)local_b0 != 0) {
              uVar21 = local_b0 & 0xffffffff;
            }
            do {
              sVar31 = uVar21;
              uVar21 = (ulong)((uint)sVar31 * 2);
            } while ((uint)sVar31 < uVar8);
            psVar14 = (stbi_uc *)realloc(*local_88,sVar31);
            if (psVar14 == (stbi_uc *)0x0) {
              stbi__g_failure_reason = "outofmem";
              return 0;
            }
            *ppsVar4 = psVar14;
            local_b0 = sVar31;
          }
          else {
            psVar14 = *local_88;
          }
          psVar14 = psVar14 + (local_70 & 0xffffffff);
          if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
            psVar20 = s->img_buffer;
            psVar13 = s->img_buffer_end;
          }
          else {
            psVar20 = s->img_buffer;
            psVar13 = s->img_buffer_end;
            iVar7 = (int)psVar13 - (int)psVar20;
            iVar11 = uVar12 - iVar7;
            if (iVar11 != 0 && iVar7 <= (int)uVar12) {
              memcpy(psVar14,psVar20,(long)iVar7);
              iVar7 = (*(s->io).read)(s->io_user_data,(char *)(psVar14 + iVar7),iVar11);
              bVar3 = false;
              s->img_buffer = s->img_buffer_end;
              local_70 = (ulong)uVar8;
              if (iVar7 != iVar11) goto LAB_00129ebd;
              goto LAB_00129df2;
            }
          }
          sVar31 = (size_t)(int)uVar12;
          if (psVar13 < psVar20 + sVar31) {
LAB_00129ebd:
            stbi__g_failure_reason = "outofdata";
            return 0;
          }
          memcpy(psVar14,psVar20,sVar31);
          s->img_buffer = s->img_buffer + sVar31;
          bVar3 = false;
          local_70 = (ulong)uVar8;
        }
        else {
          if (uVar27 == 0x49454e44) {
            if (!bVar3) {
              if ((int)local_60 != 0) {
                return 1;
              }
              if (*local_88 != (stbi_uc *)0x0) {
                local_cc = s->img_n * s->img_y * (local_78->depth * s->img_x + 7 >> 3) + s->img_y;
                psVar15 = (stbi_uc *)
                          stbi_zlib_decode_malloc_guesssize_headerflag
                                    ((char *)*local_88,iVar7,local_cc,(int *)&local_cc,
                                     (uint)(local_8c == 0));
                psVar26->expanded = psVar15;
                if (psVar15 == (stbi_uc *)0x0) {
                  return 0;
                }
                free(psVar26->idata);
                raw_len_00 = local_cc;
                psVar26->idata = (stbi_uc *)0x0;
                uVar12 = s->img_n + 1;
                uVar8 = s->img_n;
                if ((char)local_a0 != '\0') {
                  uVar8 = uVar12;
                }
                local_a4 = uVar8;
                if (local_a8 != 3) {
                  local_a4 = uVar12;
                }
                if (bVar29 != 0) {
                  local_a4 = uVar8;
                }
                if (uVar12 != local_a8) {
                  local_a4 = uVar8;
                }
                s->img_out_n = local_a4;
                iVar7 = psVar26->depth;
                iVar11 = local_a4 << (iVar7 == 0x10);
                sVar24 = psVar26->s->img_x;
                y = psVar26->s->img_y;
                if ((int)local_98 == 0) {
                  iVar7 = stbi__create_png_image_raw
                                    (psVar26,psVar26->expanded,local_cc,local_a4,sVar24,y,iVar7,
                                     (int)local_c0);
                  if (iVar7 == 0) {
                    return 0;
                  }
                }
                else {
                  psStack_e0 = psVar26->expanded;
                  local_b8 = (stbi_uc *)stbi__malloc_mad3(sVar24,y,iVar11,0);
                  local_70 = (ulong)iVar11;
                  uVar21 = (ulong)(uint)(0 << (iVar7 == 0x10));
                  do {
                    psVar2 = psVar26->s;
                    local_60 = (stbi_uc *)(long)(int)(&DAT_00149200)[uVar21];
                    uVar12 = (&DAT_00149240)[uVar21];
                    psStack_50 = (stbi_uc *)(long)(int)uVar12;
                    uVar23 = ~(&DAT_00149200)[uVar21] + psVar2->img_x + uVar12;
                    uVar10 = uVar23 / uVar12;
                    local_88 = (stbi_uc **)CONCAT44(local_88._4_4_,uVar10);
                    uVar8 = (&DAT_00149220)[uVar21];
                    uVar9 = (&DAT_00149260)[uVar21];
                    uVar16 = ~uVar8 + psVar2->img_y + uVar9;
                    uVar27 = uVar16 / uVar9;
                    local_98 = CONCAT44(local_98._4_4_,uVar27);
                    if ((uVar12 <= uVar23) && (uVar9 <= uVar16)) {
                      sVar24 = uVar10 * iVar7 * psVar2->img_n;
                      local_c8 = raw_len_00;
                      iVar11 = stbi__create_png_image_raw
                                         (psVar26,psStack_e0,raw_len_00,local_a4,uVar10,uVar27,iVar7
                                          ,(int)local_c0);
                      if (iVar11 == 0) {
                        free(local_b8);
                        return 0;
                      }
                      raw_len = sVar24;
                      if (0 < (int)uVar27) {
                        lVar22 = (long)(int)local_88;
                        local_b0 = local_98 & 0xffffffff;
                        local_60 = local_b8 + (long)local_60 * local_70;
                        iVar11 = uVar8 * (int)local_70;
                        lVar25 = (long)psStack_50 * local_70;
                        local_68 = 0;
                        local_80 = (stbi_uc *)CONCAT44(local_80._4_4_,uVar9 * (int)local_70);
                        uVar30 = local_70;
                        do {
                          if (0 < (int)local_88) {
                            psStack_50 = local_78->out;
                            lVar17 = local_68 * lVar22;
                            psVar15 = local_60 + local_78->s->img_x * iVar11;
                            lVar28 = 0;
                            do {
                              memcpy(psVar15,psStack_50 + (lVar17 + lVar28) * uVar30,uVar30);
                              lVar28 = lVar28 + 1;
                              psVar15 = psVar15 + lVar25;
                              uVar30 = local_70;
                            } while (lVar28 < lVar22);
                          }
                          local_68 = local_68 + 1;
                          iVar11 = iVar11 + (int)local_80;
                        } while (local_68 < local_b0);
                      }
                      psVar26 = local_78;
                      uVar12 = (((int)(raw_len + 7) >> 3) + 1) * (int)local_98;
                      free(local_78->out);
                      psStack_e0 = psStack_e0 + uVar12;
                      raw_len_00 = local_c8 - uVar12;
                    }
                    uVar21 = uVar21 + 1;
                  } while (uVar21 != 7);
                  psVar26->out = local_b8;
                }
                if ((char)local_a0 != '\0') {
                  z_00 = (stbi__png *)(ulong)psVar26->s->img_x;
                  tc_00 = (stbi__uint16 *)(ulong)psVar26->s->img_y;
                  iVar7 = (int)psVar26->out;
                  if (psVar26->depth == 0x10) {
                    stbi__compute_transparency16(z_00,tc_00,iVar7);
                  }
                  else {
                    stbi__compute_transparency(z_00,(stbi_uc *)tc_00,iVar7);
                  }
                }
                if (((local_8c != 0) && (stbi__de_iphone_flag != 0)) && (2 < s->img_out_n)) {
                  stbi__de_iphone((stbi__png *)psVar26->s);
                }
                if (bVar29 == 0) {
                  if ((char)local_a0 != '\0') {
                    s->img_n = s->img_n + 1;
                  }
                }
                else {
                  s->img_n = (uint)bVar29;
                  uVar12 = (uint)bVar29;
                  if (2 < (int)local_a8) {
                    uVar12 = local_a8;
                  }
                  s->img_out_n = uVar12;
                  psVar15 = psVar26->out;
                  uVar8 = psVar26->s->img_y * psVar26->s->img_x;
                  psVar14 = (stbi_uc *)stbi__malloc_mad2(uVar8,uVar12,0);
                  if (psVar14 == (stbi_uc *)0x0) {
                    stbi__g_failure_reason = "outofmem";
                    return 0;
                  }
                  if (uVar12 == 3) {
                    if (uVar8 != 0) {
                      uVar21 = 0;
                      psVar20 = psVar14;
                      do {
                        uVar30 = (ulong)psVar15[uVar21];
                        *psVar20 = asStack_4f8[uVar30 * 4];
                        psVar20[1] = asStack_4f8[uVar30 * 4 + 1];
                        psVar20[2] = asStack_4f8[uVar30 * 4 + 2];
                        psVar20 = psVar20 + 3;
                        uVar21 = uVar21 + 1;
                      } while (uVar8 != uVar21);
                    }
                  }
                  else if (uVar8 != 0) {
                    uVar21 = 0;
                    do {
                      uVar30 = (ulong)psVar15[uVar21];
                      psVar14[uVar21 * 4] = asStack_4f8[uVar30 * 4];
                      psVar14[uVar21 * 4 + 1] = asStack_4f8[uVar30 * 4 + 1];
                      psVar14[uVar21 * 4 + 2] = asStack_4f8[uVar30 * 4 + 2];
                      psVar14[uVar21 * 4 + 3] = asStack_4f8[uVar30 * 4 + 3];
                      uVar21 = uVar21 + 1;
                    } while (uVar8 != uVar21);
                  }
                  free(psVar15);
                  local_78->out = psVar14;
                  psVar26 = local_78;
                }
                free(psVar26->expanded);
                psVar26->expanded = (stbi_uc *)0x0;
                return 1;
              }
              stbi__g_failure_reason = "no IDAT";
              return 0;
            }
            goto LAB_00129e36;
          }
LAB_00129a2a:
          if (bVar3) {
LAB_00129e36:
            stbi__g_failure_reason = "first not IHDR";
            return 0;
          }
          if ((uVar9 >> 0xd & 1) == 0) {
            stbi__g_failure_reason = stbi__parse_png_file::invalid_chunk;
            stbi__parse_png_file::invalid_chunk[0] = (char)(uVar9 >> 8);
            stbi__parse_png_file::invalid_chunk[1] = (char)uVar9;
            stbi__parse_png_file::invalid_chunk[2] = (char)(uVar10 >> 8);
            stbi__parse_png_file::invalid_chunk[3] = (char)uVar10;
            return 0;
          }
          stbi__skip(s,uVar12);
          bVar3 = false;
        }
      }
    }
    else if (uVar27 == 0x49484452) {
      if (!bVar3) {
        stbi__g_failure_reason = "multiple IHDR";
        return 0;
      }
      if (uVar12 != 0xd) {
        stbi__g_failure_reason = "bad IHDR len";
        return 0;
      }
      iVar7 = stbi__get16be(s);
      uVar12 = stbi__get16be(s);
      uVar12 = uVar12 | iVar7 << 0x10;
      s->img_x = uVar12;
      if (0x1000000 < uVar12) {
LAB_00129e07:
        stbi__g_failure_reason = "too large";
        return 0;
      }
      iVar7 = stbi__get16be(s);
      uVar12 = stbi__get16be(s);
      psVar26 = local_78;
      psVar14 = local_80;
      uVar12 = uVar12 | iVar7 << 0x10;
      s->img_y = uVar12;
      if (0x1000000 < uVar12) goto LAB_00129e07;
      pbVar1 = s->img_buffer;
      psVar20 = s->img_buffer_end;
      if (pbVar1 < psVar20) {
        s->img_buffer = pbVar1 + 1;
        bVar19 = *pbVar1;
        psVar13 = pbVar1 + 1;
      }
      else {
        if (s->read_from_callbacks == 0) {
          local_78->depth = 0;
          goto LAB_00129f20;
        }
        iVar7 = (*(s->io).read)(s->io_user_data,(char *)local_80,s->buflen);
        if (iVar7 == 0) {
          s->read_from_callbacks = 0;
          s->buffer_start[0] = '\0';
          bVar19 = 0;
          psVar20 = psVar15;
        }
        else {
          bVar19 = *psVar14;
          psVar20 = psVar14 + iVar7;
        }
        s->img_buffer_end = psVar20;
        s->img_buffer = psVar15;
        psVar13 = psVar15;
      }
      psVar26->depth = (uint)bVar19;
      if ((0x10 < bVar19) || ((0x10116U >> (bVar19 & 0x1f) & 1) == 0)) {
LAB_00129f20:
        stbi__g_failure_reason = "1/2/4/8/16-bit only";
        return 0;
      }
      if (psVar13 < psVar20) {
        s->img_buffer = psVar13 + 1;
        bVar19 = *psVar13;
        psVar13 = psVar13 + 1;
LAB_00129c9a:
        if (6 < bVar19) {
LAB_00129e22:
          stbi__g_failure_reason = "bad ctype";
          return 0;
        }
        if (bVar19 == 3) {
          if (psVar26->depth == 0x10) goto LAB_00129e22;
          uVar21 = 3;
          bVar19 = 3;
          bVar29 = 3;
        }
        else {
          if ((bVar19 & 1) != 0) goto LAB_00129e22;
          uVar21 = (ulong)bVar19;
        }
      }
      else {
        if (s->read_from_callbacks != 0) {
          iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar14,s->buflen);
          if (iVar7 == 0) {
            s->read_from_callbacks = 0;
            s->buffer_start[0] = '\0';
            bVar19 = 0;
            psVar20 = psVar15;
          }
          else {
            bVar19 = *psVar14;
            psVar20 = psVar14 + iVar7;
          }
          s->img_buffer_end = psVar20;
          s->img_buffer = psVar15;
          psVar13 = psVar15;
          goto LAB_00129c9a;
        }
        bVar19 = 0;
        uVar21 = 0;
      }
      psVar14 = local_80;
      if (psVar13 < psVar20) {
        s->img_buffer = psVar13 + 1;
        sVar5 = *psVar13;
LAB_00129d37:
        if (sVar5 != '\0') {
          stbi__g_failure_reason = "bad comp method";
          return 0;
        }
      }
      else if (s->read_from_callbacks != 0) {
        iVar7 = (*(s->io).read)(s->io_user_data,(char *)local_80,s->buflen);
        if (iVar7 == 0) {
          s->read_from_callbacks = 0;
          s->buffer_start[0] = '\0';
          sVar5 = '\0';
          psVar14 = psVar15;
        }
        else {
          sVar5 = *psVar14;
          psVar14 = psVar14 + iVar7;
        }
        s->img_buffer_end = psVar14;
        s->img_buffer = psVar15;
        goto LAB_00129d37;
      }
      sVar5 = stbi__get8(s);
      if (sVar5 != '\0') {
        stbi__g_failure_reason = "bad filter method";
        return 0;
      }
      bVar6 = stbi__get8(s);
      if (1 < bVar6) {
        stbi__g_failure_reason = "bad interlace method";
        return 0;
      }
      uVar12 = s->img_x;
      if ((uVar12 == 0) || (uVar8 = s->img_y, uVar8 == 0)) {
        stbi__g_failure_reason = "0-pixel image";
        return 0;
      }
      local_98 = (ulong)bVar6;
      local_c0 = uVar21;
      if (bVar29 == 0) {
        uVar9 = (uint)(3 < bVar19) + ((uint)uVar21 & 2) + 1;
        s->img_n = uVar9;
        if ((uint)((0x40000000 / (ulong)uVar12) / (ulong)uVar9) < uVar8) goto LAB_00129e07;
        bVar3 = false;
        bVar29 = 0;
        if ((int)local_60 == 2) {
          return 1;
        }
      }
      else {
        s->img_n = 1;
        bVar3 = false;
        if ((uint)(0x40000000 / (ulong)uVar12 >> 2) < uVar8) goto LAB_00129e07;
      }
    }
    else if (uVar27 == 0x504c5445) {
      if (bVar3) goto LAB_00129e36;
      if ((0x300 < uVar12) ||
         (uVar9 = uVar8 * 0xaaab >> 0x11, uVar21 = (ulong)uVar9, uVar9 * 3 != uVar12)) {
        stbi__g_failure_reason = "invalid PLTE";
        return 0;
      }
      bVar3 = false;
      local_68 = uVar21;
      if (2 < uVar8) {
        psVar20 = s->img_buffer;
        psVar13 = s->img_buffer_end;
        uVar30 = 0;
        do {
          if (psVar20 < psVar13) {
            s->img_buffer = psVar20 + 1;
            sVar5 = *psVar20;
            psVar20 = psVar20 + 1;
          }
          else if (s->read_from_callbacks == 0) {
            sVar5 = '\0';
          }
          else {
            iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar14,s->buflen);
            if (iVar7 == 0) {
              s->read_from_callbacks = 0;
              s->buffer_start[0] = '\0';
              sVar5 = '\0';
              psVar13 = psVar15;
            }
            else {
              sVar5 = *psVar14;
              psVar13 = psVar14 + iVar7;
            }
            s->img_buffer_end = psVar13;
            s->img_buffer = psVar15;
            psVar20 = psVar15;
          }
          asStack_4f8[uVar30 * 4] = sVar5;
          if (psVar20 < psVar13) {
            s->img_buffer = psVar20 + 1;
            sVar5 = *psVar20;
            psVar20 = psVar20 + 1;
          }
          else if (s->read_from_callbacks == 0) {
            sVar5 = '\0';
          }
          else {
            iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar14,s->buflen);
            if (iVar7 == 0) {
              s->read_from_callbacks = 0;
              s->buffer_start[0] = '\0';
              sVar5 = '\0';
              psVar13 = psVar15;
            }
            else {
              sVar5 = *psVar14;
              psVar13 = psVar14 + iVar7;
            }
            s->img_buffer_end = psVar13;
            s->img_buffer = psVar15;
            psVar20 = psVar15;
          }
          asStack_4f8[uVar30 * 4 + 1] = sVar5;
          if (psVar20 < psVar13) {
            s->img_buffer = psVar20 + 1;
            sVar5 = *psVar20;
            psVar20 = psVar20 + 1;
          }
          else if (s->read_from_callbacks == 0) {
            sVar5 = '\0';
          }
          else {
            iVar7 = (*(s->io).read)(s->io_user_data,(char *)psVar14,s->buflen);
            if (iVar7 == 0) {
              s->read_from_callbacks = 0;
              s->buffer_start[0] = '\0';
              sVar5 = '\0';
              psVar13 = psVar15;
            }
            else {
              sVar5 = *psVar14;
              psVar13 = psVar14 + iVar7;
            }
            s->img_buffer_end = psVar13;
            s->img_buffer = psVar15;
            psVar20 = psVar15;
          }
          asStack_4f8[uVar30 * 4 + 2] = sVar5;
          asStack_4f8[uVar30 * 4 + 3] = 0xff;
          uVar30 = uVar30 + 1;
        } while (uVar21 != uVar30);
      }
    }
    else {
      if (uVar27 != 0x74524e53) goto LAB_00129a2a;
      if (bVar3) goto LAB_00129e36;
      if (*local_88 != (stbi_uc *)0x0) {
        stbi__g_failure_reason = "tRNS after IDAT";
        return 0;
      }
      if (bVar29 == 0) {
        uVar8 = s->img_n;
        if ((uVar8 & 1) == 0) {
          stbi__g_failure_reason = "tRNS with alpha";
          return 0;
        }
        if (uVar8 * 2 != uVar12) goto LAB_00129eb4;
        uVar18 = (uint7)(uint3)(uVar8 * 2 >> 8);
        if (local_78->depth == 0x10) {
          local_a0 = CONCAT71(uVar18,1);
          if (0 < (int)uVar8) {
            lVar22 = 0;
            do {
              iVar7 = stbi__get16be(s);
              local_e6[lVar22] = (short)iVar7;
              lVar22 = lVar22 + 1;
            } while (lVar22 < s->img_n);
          }
        }
        else {
          local_a0 = CONCAT71(uVar18,1);
          if (0 < (int)uVar8) {
            lVar22 = 0;
            do {
              iVar7 = stbi__get16be(s);
              local_54[lVar22] = ""[psVar26->depth] * (char)iVar7;
              lVar22 = lVar22 + 1;
            } while (lVar22 < s->img_n);
          }
        }
        bVar3 = false;
        bVar29 = 0;
      }
      else {
        if ((int)local_60 == 2) {
          s->img_n = 4;
          return 1;
        }
        if ((uint)local_68 == 0) {
          stbi__g_failure_reason = "tRNS before PLTE";
          return 0;
        }
        if ((uint)local_68 < uVar12) {
LAB_00129eb4:
          stbi__g_failure_reason = "bad tRNS len";
          return 0;
        }
        bVar29 = 4;
        bVar3 = false;
        if (uVar12 != 0) {
          psVar20 = s->img_buffer;
          psVar13 = s->img_buffer_end;
          uVar21 = 0;
          do {
            if (psVar20 < psVar13) {
              s->img_buffer = psVar20 + 1;
              sVar5 = *psVar20;
              psVar20 = psVar20 + 1;
            }
            else if (s->read_from_callbacks == 0) {
              sVar5 = '\0';
            }
            else {
              iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar14,s->buflen);
              if (iVar11 == 0) {
                s->read_from_callbacks = 0;
                s->buffer_start[0] = '\0';
                sVar5 = '\0';
                psVar13 = psVar15;
              }
              else {
                sVar5 = *psVar14;
                psVar13 = psVar14 + iVar11;
              }
              s->img_buffer_end = psVar13;
              s->img_buffer = psVar15;
              psVar20 = psVar15;
            }
            asStack_4f8[uVar21 * 4 + 3] = sVar5;
            uVar21 = uVar21 + 1;
          } while (uVar8 + iVar7 * 0x10000 != uVar21);
        }
      }
    }
LAB_00129df2:
    stbi__get16be(s);
    stbi__get16be(s);
  } while( true );
}

Assistant:

static int stbi__parse_png_file(stbi__png *z, int scan, int req_comp)
{
   stbi_uc palette[1024], pal_img_n=0;
   stbi_uc has_trans=0, tc[3]={0};
   stbi__uint16 tc16[3];
   stbi__uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k,interlace=0, color=0, is_iphone=0;
   stbi__context *s = z->s;

   z->expanded = NULL;
   z->idata = NULL;
   z->out = NULL;

   if (!stbi__check_png_header(s)) return 0;

   if (scan == STBI__SCAN_type) return 1;

   for (;;) {
      stbi__pngchunk c = stbi__get_chunk_header(s);
      switch (c.type) {
         case STBI__PNG_TYPE('C','g','B','I'):
            is_iphone = 1;
            stbi__skip(s, c.length);
            break;
         case STBI__PNG_TYPE('I','H','D','R'): {
            int comp,filter;
            if (!first) return stbi__err("multiple IHDR","Corrupt PNG");
            first = 0;
            if (c.length != 13) return stbi__err("bad IHDR len","Corrupt PNG");
            s->img_x = stbi__get32be(s); if (s->img_x > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            s->img_y = stbi__get32be(s); if (s->img_y > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            z->depth = stbi__get8(s);  if (z->depth != 1 && z->depth != 2 && z->depth != 4 && z->depth != 8 && z->depth != 16)  return stbi__err("1/2/4/8/16-bit only","PNG not supported: 1/2/4/8/16-bit only");
            color = stbi__get8(s);  if (color > 6)         return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3 && z->depth == 16)                  return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return stbi__err("bad ctype","Corrupt PNG");
            comp  = stbi__get8(s);  if (comp) return stbi__err("bad comp method","Corrupt PNG");
            filter= stbi__get8(s);  if (filter) return stbi__err("bad filter method","Corrupt PNG");
            interlace = stbi__get8(s); if (interlace>1) return stbi__err("bad interlace method","Corrupt PNG");
            if (!s->img_x || !s->img_y) return stbi__err("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");
               if (scan == STBI__SCAN_header) return 1;
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return stbi__err("too large","Corrupt PNG");
               // if SCAN_header, have to scan to see if we have a tRNS
            }
            break;
         }

         case STBI__PNG_TYPE('P','L','T','E'):  {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (c.length > 256*3) return stbi__err("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return stbi__err("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = stbi__get8(s);
               palette[i*4+1] = stbi__get8(s);
               palette[i*4+2] = stbi__get8(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case STBI__PNG_TYPE('t','R','N','S'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (z->idata) return stbi__err("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == STBI__SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return stbi__err("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return stbi__err("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = stbi__get8(s);
            } else {
               if (!(s->img_n & 1)) return stbi__err("tRNS with alpha","Corrupt PNG");
               if (c.length != (stbi__uint32) s->img_n*2) return stbi__err("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               if (z->depth == 16) {
                  for (k = 0; k < s->img_n; ++k) tc16[k] = (stbi__uint16)stbi__get16be(s); // copy the values as-is
               } else {
                  for (k = 0; k < s->img_n; ++k) tc[k] = (stbi_uc)(stbi__get16be(s) & 255) * stbi__depth_scale_table[z->depth]; // non 8-bit images will be larger
               }
            }
            break;
         }

         case STBI__PNG_TYPE('I','D','A','T'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (pal_img_n && !pal_len) return stbi__err("no PLTE","Corrupt PNG");
            if (scan == STBI__SCAN_header) { s->img_n = pal_img_n; return 1; }
            if ((int)(ioff + c.length) < (int)ioff) return 0;
            if (ioff + c.length > idata_limit) {
               stbi__uint32 idata_limit_old = idata_limit;
               stbi_uc *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               STBI_NOTUSED(idata_limit_old);
               p = (stbi_uc *) STBI_REALLOC_SIZED(z->idata, idata_limit_old, idata_limit); if (p == NULL) return stbi__err("outofmem", "Out of memory");
               z->idata = p;
            }
            if (!stbi__getn(s, z->idata+ioff,c.length)) return stbi__err("outofdata","Corrupt PNG");
            ioff += c.length;
            break;
         }

         case STBI__PNG_TYPE('I','E','N','D'): {
            stbi__uint32 raw_len, bpl;
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (scan != STBI__SCAN_load) return 1;
            if (z->idata == NULL) return stbi__err("no IDAT","Corrupt PNG");
            // initial guess for decoded data size to avoid unnecessary reallocs
            bpl = (s->img_x * z->depth + 7) / 8; // bytes per line, per component
            raw_len = bpl * s->img_y * s->img_n /* pixels */ + s->img_y /* filter mode per row */;
            z->expanded = (stbi_uc *) stbi_zlib_decode_malloc_guesssize_headerflag((char *) z->idata, ioff, raw_len, (int *) &raw_len, !is_iphone);
            if (z->expanded == NULL) return 0; // zlib should set error
            STBI_FREE(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!stbi__create_png_image(z, z->expanded, raw_len, s->img_out_n, z->depth, color, interlace)) return 0;
            if (has_trans) {
               if (z->depth == 16) {
                  if (!stbi__compute_transparency16(z, tc16, s->img_out_n)) return 0;
               } else {
                  if (!stbi__compute_transparency(z, tc, s->img_out_n)) return 0;
               }
            }
            if (is_iphone && stbi__de_iphone_flag && s->img_out_n > 2)
               stbi__de_iphone(z);
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!stbi__expand_png_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            } else if (has_trans) {
               // non-paletted image with tRNS -> source image has (constant) alpha
               ++s->img_n;
            }
            STBI_FREE(z->expanded); z->expanded = NULL;
            return 1;
         }

         default:
            // if critical, fail
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX PNG chunk not known";
               invalid_chunk[0] = STBI__BYTECAST(c.type >> 24);
               invalid_chunk[1] = STBI__BYTECAST(c.type >> 16);
               invalid_chunk[2] = STBI__BYTECAST(c.type >>  8);
               invalid_chunk[3] = STBI__BYTECAST(c.type >>  0);
               #endif
               return stbi__err(invalid_chunk, "PNG not supported: unknown PNG chunk type");
            }
            stbi__skip(s, c.length);
            break;
      }
      // end of PNG chunk, read and skip CRC
      stbi__get32be(s);
   }
}